

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtcppacketbuilder.cpp
# Opt level: O0

int __thiscall
jrtplib::RTCPPacketBuilder::FillInReportBlocks
          (RTCPPacketBuilder *this,RTCPCompoundPacketBuilder *rtcpcomppack,RTPTime *curtime,
          int maxcount,bool *full,int *added,int *skipped,bool *atendoflist)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  uint32_t ssrc;
  uint32_t uVar4;
  uint32_t uVar5;
  uint32_t exthighestseq;
  uint uVar6;
  int32_t iVar7;
  uint32_t uVar8;
  uint32_t uVar9;
  int iVar10;
  RTPSourceData *pRVar11;
  double dVar12;
  byte local_109;
  RTPTime local_e8;
  RTPTime lastrtptime_1;
  bool shouldprocess_1;
  double diff2;
  RTPTime local_c8;
  RTPTime diff_1;
  uint32_t l;
  uint32_t m;
  RTPNTPTime srtime;
  uint32_t dlsr;
  uint32_t lsr;
  uint32_t jitter;
  int32_t *packlost;
  uint32_t diff;
  double frac;
  double lost;
  uint8_t fraclost;
  uint32_t expected;
  uint32_t curseq;
  uint32_t prevseq;
  uint32_t num;
  uint32_t rr_ssrc;
  RTPTime lastrtptime;
  bool local_52;
  bool shouldprocess;
  int status;
  bool atend;
  bool filled;
  int iStack_4c;
  bool done;
  int skippedcount;
  int addedcount;
  RTPSourceData *srcdat;
  int *added_local;
  bool *full_local;
  int maxcount_local;
  RTPTime *curtime_local;
  RTCPCompoundPacketBuilder *rtcpcomppack_local;
  RTCPPacketBuilder *this_local;
  
  iStack_4c = 0;
  status = 0;
  bVar3 = false;
  local_52 = false;
  bVar1 = false;
  bVar2 = RTPSources::GotoFirstSource(this->sources);
  if (bVar2) {
    do {
      lastrtptime.m_t._7_1_ = 0;
      pRVar11 = RTPSources::GetCurrentSourceInfo(this->sources);
      bVar2 = RTPSourceData::IsOwnSSRC(pRVar11);
      if (((!bVar2) && (bVar2 = RTPSourceData::IsCSRC(pRVar11), !bVar2)) &&
         (bVar2 = RTPSourceData::INF_HasSentData(pRVar11), bVar2)) {
        if ((this->firstpacket & 1U) == 0) {
          _num = RTPSourceData::INF_GetLastRTPPacketTime(pRVar11);
          bVar2 = RTPTime::operator>((RTPTime *)&num,&this->prevbuildtime);
          if (bVar2) {
            lastrtptime.m_t._7_1_ = 1;
          }
        }
        else {
          lastrtptime.m_t._7_1_ = 1;
        }
      }
      if ((lastrtptime.m_t._7_1_ & 1) != 0) {
        bVar2 = RTPSourceData::IsProcessedInRTCP(pRVar11);
        if (bVar2) {
          status = status + 1;
        }
        else {
          ssrc = RTPSourceData::GetSSRC(pRVar11);
          uVar4 = RTPSourceData::INF_GetNumPacketsReceivedInInterval(pRVar11);
          uVar5 = RTPSourceData::INF_GetSavedExtendedSequenceNumber(pRVar11);
          exthighestseq = RTPSourceData::INF_GetExtendedHighestSequenceNumber(pRVar11);
          uVar6 = exthighestseq - uVar5;
          if (uVar6 < uVar4) {
            lost._3_1_ = '\0';
          }
          else {
            lost._3_1_ = (uint8_t)(int)(((double)(uVar6 - uVar4) / (double)uVar6) * 256.0);
          }
          uVar4 = RTPSourceData::INF_GetBaseSequenceNumber(pRVar11);
          iVar7 = RTPSourceData::INF_GetNumPacketsReceived(pRVar11);
          uVar5 = RTPSourceData::INF_GetJitter(pRVar11);
          bVar2 = RTPSourceData::SR_HasInfo(pRVar11);
          if (bVar2) {
            _l = RTPSourceData::SR_GetNTPTimestamp(pRVar11);
            uVar8 = RTPNTPTime::GetMSW((RTPNTPTime *)&l);
            uVar9 = RTPNTPTime::GetLSW((RTPNTPTime *)&l);
            diff_1.m_t._4_4_ = uVar9 >> 0x10;
            srtime.lsw = uVar8 << 0x10 | diff_1.m_t._4_4_;
            local_c8 = (RTPTime)curtime->m_t;
            diff2 = (double)RTPSourceData::SR_GetReceiveTime(pRVar11);
            RTPTime::operator-=(&local_c8,(RTPTime *)&diff2);
            dVar12 = RTPTime::GetDouble(&local_c8);
            srtime.msw = (uint32_t)(long)(dVar12 * 65536.0);
          }
          else {
            srtime.lsw = 0;
            srtime.msw = 0;
          }
          iVar10 = RTCPCompoundPacketBuilder::AddReportBlock
                             (rtcpcomppack,ssrc,lost._3_1_,(exthighestseq - uVar4) - iVar7,
                              exthighestseq,uVar5,srtime.lsw,srtime.msw);
          if (iVar10 < 0) {
            if (iVar10 != -0x2b) {
              return iVar10;
            }
            bVar3 = true;
            local_52 = true;
          }
          else {
            iStack_4c = iStack_4c + 1;
            if (maxcount <= iStack_4c) {
              bVar3 = true;
              bVar2 = RTPSources::GotoNextSource(this->sources);
              if (!bVar2) {
                bVar1 = true;
              }
            }
            RTPSourceData::INF_StartNewInterval(pRVar11);
            RTPSourceData::SetProcessedInRTCP(pRVar11,true);
          }
        }
      }
      if ((!bVar3) && (bVar2 = RTPSources::GotoNextSource(this->sources), !bVar2)) {
        bVar1 = true;
        bVar3 = true;
      }
    } while (!bVar3);
  }
  *added = iStack_4c;
  *skipped = status;
  *full = local_52;
  if (bVar1 == false) {
    lastrtptime_1.m_t._7_1_ = 0;
    do {
      pRVar11 = RTPSources::GetCurrentSourceInfo(this->sources);
      bVar3 = RTPSourceData::IsOwnSSRC(pRVar11);
      if (((!bVar3) && (bVar3 = RTPSourceData::IsCSRC(pRVar11), !bVar3)) &&
         (bVar3 = RTPSourceData::INF_HasSentData(pRVar11), bVar3)) {
        if ((this->firstpacket & 1U) == 0) {
          local_e8 = RTPSourceData::INF_GetLastRTPPacketTime(pRVar11);
          bVar3 = RTPTime::operator>(&local_e8,&this->prevbuildtime);
          if (bVar3) {
            lastrtptime_1.m_t._7_1_ = 1;
          }
        }
        else {
          lastrtptime_1.m_t._7_1_ = 1;
        }
      }
      if (((lastrtptime_1.m_t._7_1_ & 1) != 0) &&
         (bVar3 = RTPSourceData::IsProcessedInRTCP(pRVar11), bVar3)) {
        lastrtptime_1.m_t._7_1_ = 0;
      }
      if (((lastrtptime_1.m_t._7_1_ & 1) == 0) &&
         (bVar3 = RTPSources::GotoNextSource(this->sources), !bVar3)) {
        bVar1 = true;
      }
      local_109 = 0;
      if (bVar1 == false) {
        local_109 = lastrtptime_1.m_t._7_1_ ^ 0xff;
      }
    } while ((local_109 & 1) != 0);
  }
  *atendoflist = bVar1;
  return 0;
}

Assistant:

int RTCPPacketBuilder::FillInReportBlocks(RTCPCompoundPacketBuilder *rtcpcomppack,const RTPTime &curtime,int maxcount,bool *full,int *added,int *skipped,bool *atendoflist)
{
	RTPSourceData *srcdat;
	int addedcount = 0;
	int skippedcount = 0;
	bool done = false;
	bool filled = false;
	bool atend = false;
	int status;

	if (sources.GotoFirstSource())
	{
		do
		{
			bool shouldprocess = false;
			
			srcdat = sources.GetCurrentSourceInfo();
			if (!srcdat->IsOwnSSRC()) // don't send to ourselves
			{
				if (!srcdat->IsCSRC()) // p 35: no reports should go to CSRCs
				{
					if (srcdat->INF_HasSentData()) // if this isn't true, INF_GetLastRTPPacketTime() won't make any sense
					{
						if (firstpacket)
							shouldprocess = true;
						else
						{
							// p 35: only if rtp packets were received since the last RTP packet, a report block
							// should be added
							
							RTPTime lastrtptime = srcdat->INF_GetLastRTPPacketTime();
							
							if (lastrtptime > prevbuildtime)
								shouldprocess = true;
						}
					}
				}
			}

			if (shouldprocess)
			{
				if (srcdat->IsProcessedInRTCP()) // already covered this one
				{
					skippedcount++;
				}
				else
				{
					uint32_t rr_ssrc = srcdat->GetSSRC();
					uint32_t num = srcdat->INF_GetNumPacketsReceivedInInterval();
					uint32_t prevseq = srcdat->INF_GetSavedExtendedSequenceNumber();
					uint32_t curseq = srcdat->INF_GetExtendedHighestSequenceNumber();
					uint32_t expected = curseq-prevseq;
					uint8_t fraclost;
					
					if (expected < num) // got duplicates
						fraclost = 0;
					else
					{
						double lost = (double)(expected-num);
						double frac = lost/((double)expected);
						fraclost = (uint8_t)(frac*256.0);
					}

					expected = curseq-srcdat->INF_GetBaseSequenceNumber();
					num = srcdat->INF_GetNumPacketsReceived();

					uint32_t diff = expected-num;
					int32_t *packlost = (int32_t *)&diff;
					
					uint32_t jitter = srcdat->INF_GetJitter();
					uint32_t lsr;
					uint32_t dlsr; 	

					if (!srcdat->SR_HasInfo())
					{
						lsr = 0;
						dlsr = 0;
					}
					else
					{
						RTPNTPTime srtime = srcdat->SR_GetNTPTimestamp();
						uint32_t m = (srtime.GetMSW()&0xFFFF);
						uint32_t l = ((srtime.GetLSW()>>16)&0xFFFF);
						lsr = ((m<<16)|l);

						RTPTime diff = curtime;
						diff -= srcdat->SR_GetReceiveTime();
						double diff2 = diff.GetDouble();
						diff2 *= 65536.0;
						dlsr = (uint32_t)diff2;
					}

					status = rtcpcomppack->AddReportBlock(rr_ssrc,fraclost,*packlost,curseq,jitter,lsr,dlsr);
					if (status < 0)
					{
						if (status == ERR_RTP_RTCPCOMPPACKBUILDER_NOTENOUGHBYTESLEFT)
						{
							done = true;
							filled = true;
						}
						else
							return status;
					}
					else
					{
						addedcount++;
						if (addedcount >= maxcount)
						{
							done = true;
							if (!sources.GotoNextSource())
								atend = true;
						}
						srcdat->INF_StartNewInterval();
						srcdat->SetProcessedInRTCP(true);
					}
				}
			}

			if (!done)
			{
				if (!sources.GotoNextSource())
				{
					atend = true;
					done = true;
				}
			}

		} while (!done);
	}
	
	*added = addedcount;
	*skipped = skippedcount;
	*full = filled;
	
	if (!atend) // search for available sources
	{
		bool shouldprocess = false;
		
		do
		{	
			srcdat = sources.GetCurrentSourceInfo();
			if (!srcdat->IsOwnSSRC()) // don't send to ourselves
			{
				if (!srcdat->IsCSRC()) // p 35: no reports should go to CSRCs
				{
					if (srcdat->INF_HasSentData()) // if this isn't true, INF_GetLastRTPPacketTime() won't make any sense
					{
						if (firstpacket)
							shouldprocess = true;
						else
						{
							// p 35: only if rtp packets were received since the last RTP packet, a report block
							// should be added
							
							RTPTime lastrtptime = srcdat->INF_GetLastRTPPacketTime();
							
							if (lastrtptime > prevbuildtime)
								shouldprocess = true;
						}
					}
				}
			}
			
			if (shouldprocess)
			{
				if (srcdat->IsProcessedInRTCP())
					shouldprocess = false;
			}

			if (!shouldprocess)
			{
				if (!sources.GotoNextSource())
					atend = true;
			}
	
		} while (!atend && !shouldprocess);
	}	

	*atendoflist = atend;
	return 0;	
}